

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_Interval __thiscall
ON_PlaneEquation::ValueRange
          (ON_PlaneEquation *this,size_t point_index_count,uint *point_index_list,
          ON_3dPointListRef *point_list)

{
  ON_Interval OVar1;
  
  OVar1 = ValueRange(this,point_index_count,1,point_index_list,point_list);
  return (ON_Interval)OVar1.m_t;
}

Assistant:

ON_Interval ON_PlaneEquation::ValueRange(
  size_t point_index_count,
  const unsigned int* point_index_list,
  const class ON_3dPointListRef& point_list
  ) const
{
  size_t point_index_stride = 1;

  return ValueRange(
    point_index_count,
    point_index_stride,
    point_index_list,
    point_list
    );
}